

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool ON_GetConicEquationThrough6Points
               (int stride,double *points2d,double *conic,double *max_pivot,double *min_pivot,
               double *zero_pivot)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  bool bVar19;
  undefined4 in_EAX;
  int iVar20;
  ON_2dPoint *pOVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  uint uVar39;
  undefined4 uVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double M [5] [5];
  double N [5] [5];
  ON_2dPoint pts [6];
  double adStack_2c0 [2];
  double *local_2b0;
  double local_2a8;
  undefined1 local_2a0 [8];
  double dStack_298;
  undefined1 local_290 [24];
  double local_278;
  undefined1 local_270 [16];
  double local_260;
  double dStack_250;
  double local_248;
  undefined1 local_240 [8];
  double adStack_238 [4];
  undefined1 local_218 [8];
  double adStack_210 [4];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [16];
  undefined8 local_1c8;
  double dStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  double dStack_1a0;
  undefined1 local_198 [12];
  undefined4 uStack_18c;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double local_160 [5];
  undefined8 local_138;
  double local_120;
  undefined8 local_108;
  double *local_f8;
  undefined8 local_d8;
  double local_d0;
  double local_a8;
  ON_2dPoint local_98;
  double local_88 [11];
  
  if (conic == (double *)0x0) {
    return false;
  }
  conic[4] = 0.0;
  conic[5] = 0.0;
  conic[2] = 0.0;
  conic[3] = 0.0;
  *conic = 0.0;
  conic[1] = 0.0;
  if (max_pivot != (double *)0x0) {
    *max_pivot = 0.0;
  }
  if (min_pivot != (double *)0x0) {
    *min_pivot = 0.0;
  }
  if (zero_pivot != (double *)0x0) {
    *zero_pivot = 0.0;
  }
  local_98.x = points2d[0];
  local_98.y = points2d[1];
  uVar31 = SUB84(local_98.x,0);
  uVar33 = (undefined4)((ulong)local_98.x >> 0x20);
  uVar37 = SUB84(local_98.y,0);
  uVar38 = (undefined4)((ulong)local_98.y >> 0x20);
  auVar2._8_4_ = (int)-(ulong)(ABS(local_98.y) < 1.23432101234321e+308);
  auVar2._0_8_ = -(ulong)(ABS(local_98.x) < 1.23432101234321e+308);
  auVar2._12_4_ = (int)(-(ulong)(ABS(local_98.y) < 1.23432101234321e+308) >> 0x20);
  iVar20 = movmskpd(in_EAX,auVar2);
  if (iVar20 == 3) {
    pdVar25 = points2d + stride;
    local_1d8._8_4_ = uVar37;
    local_1d8._0_8_ = local_98.y;
    local_1d8._12_4_ = uVar38;
    uVar35 = uVar31;
    uVar36 = uVar33;
    uVar32 = uVar37;
    uVar34 = uVar38;
    local_2b0 = zero_pivot;
    for (lVar29 = 0x10; lVar29 != 0x60; lVar29 = lVar29 + 0x10) {
      local_198._4_4_ = uVar36;
      local_198._0_4_ = uVar35;
      local_198._8_4_ = uVar37;
      uStack_18c = uVar38;
      local_1b8 = (double)CONCAT44(uVar33,uVar31);
      pOVar21 = (ON_2dPoint *)((long)&local_98.x + lVar29);
      local_1a8 = *pdVar25;
      dStack_1a0 = pdVar25[1];
      pOVar21->x = local_1a8;
      *(double *)((long)&local_98.y + lVar29) = dStack_1a0;
      adStack_2c0[0] = 2.87273284016843e-317;
      local_1c8._0_4_ = uVar32;
      local_1c8._4_4_ = uVar34;
      bVar19 = ON_2dPoint::IsValid(pOVar21);
      if (!bVar19) {
        return false;
      }
      uVar40 = (undefined4)((ulong)local_1a8 >> 0x20);
      uVar32 = SUB84(dStack_1a0,0);
      uVar34 = (undefined4)((ulong)dStack_1a0 >> 0x20);
      uVar31 = SUB84(local_1b8,0);
      uVar33 = (undefined4)((ulong)local_1b8 >> 0x20);
      uVar35 = SUB84(local_1a8,0);
      uVar36 = uVar40;
      uVar37 = uVar32;
      uVar38 = uVar34;
      if ((local_198._0_8_ <= local_1a8) &&
         (uVar35 = local_198._0_4_, uVar36 = local_198._4_4_, uVar37 = local_198._8_4_,
         uVar38 = local_198._12_4_, local_1b8 < local_1a8)) {
        uVar31 = SUB84(local_1a8,0);
        uVar33 = uVar40;
      }
      if ((double)local_1d8._0_8_ <= dStack_1a0) {
        if (dStack_1a0 < (double)CONCAT44(local_1c8._4_4_,(undefined4)local_1c8) ||
            dStack_1a0 == (double)CONCAT44(local_1c8._4_4_,(undefined4)local_1c8))
        goto LAB_0058b944;
      }
      else {
        local_1d8._8_4_ = uVar32;
        local_1d8._0_8_ = dStack_1a0;
        local_1d8._12_4_ = uVar34;
LAB_0058b944:
        uVar32 = (undefined4)local_1c8;
        uVar34 = local_1c8._4_4_;
      }
      pdVar25 = pdVar25 + stride;
    }
    dVar9 = (double)CONCAT44(uVar33,uVar31) - (double)CONCAT44(uVar36,uVar35);
    dVar13 = (double)CONCAT44(uVar34,uVar32) - (double)local_1d8._0_8_;
    if (dVar13 <= dVar9) {
      if (dVar9 <= 0.0) {
        return false;
      }
      dVar10 = (dVar13 / dVar9) * (dVar13 / dVar9);
    }
    else {
      dVar10 = (dVar9 / dVar13) * (dVar9 / dVar13);
      dVar9 = dVar13;
    }
    dVar9 = SQRT(dVar10 + 1.0) * dVar9;
    if (0.0 < dVar9) {
      dVar9 = 1.0 / dVar9;
      pOVar21 = &local_98;
      for (lVar29 = 0x18; lVar29 != 0xe0; lVar29 = lVar29 + 0x28) {
        dVar13 = (pOVar21->x - local_88[8]) * dVar9;
        dVar10 = (pOVar21->y - local_88[9]) * dVar9;
        auVar6._8_4_ = SUB84(dVar13 * dVar10,0);
        auVar6._0_8_ = dVar13 * dVar13;
        auVar6._12_4_ = (int)((ulong)(dVar13 * dVar10) >> 0x20);
        *(undefined1 (*) [16])((long)adStack_2c0 + lVar29) = auVar6;
        *(double *)((long)&local_2b0 + lVar29) = dVar10 * dVar10;
        auVar3._8_4_ = SUB84(dVar10,0);
        auVar3._0_8_ = dVar13;
        auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
        *(undefined1 (*) [16])(local_2a0 + lVar29 + -8) = auVar3;
        pOVar21 = pOVar21 + 1;
      }
      local_1c8 = local_88[8];
      dStack_1c0 = local_88[9];
      local_198._8_4_ = SUB84(dVar9,0);
      local_198._0_8_ = dVar9;
      uStack_18c = (int)((ulong)dVar9 >> 0x20);
      uStack_1b0 = 0;
      pdVar25 = &local_168;
      uVar30 = 0;
      adStack_2c0[0] = 2.87293145455806e-317;
      local_1b8 = dVar9;
      memset(pdVar25,0,0xc0);
      local_a8 = 1.0;
      local_d8 = 0x3ff0000000000000;
      local_108 = 0x3ff0000000000000;
      local_138 = 0x3ff0000000000000;
      local_168 = 1.0;
      uVar22 = 0;
      dVar9 = ABS(local_2a8);
      while ((int)uVar30 != 0x18) {
        lVar29 = uVar30 * 8;
        uVar30 = uVar30 + 1;
        if (dVar9 < ABS(*(double *)(local_2a0 + lVar29))) {
          uVar22 = uVar30 & 0xffffffff;
          dVar9 = ABS(*(double *)(local_2a0 + lVar29));
        }
      }
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        iVar20 = (int)uVar22;
        if (8 < iVar20 + 4U) {
          for (lVar29 = 0; lVar29 != 5; lVar29 = lVar29 + 1) {
            uVar1 = *(undefined8 *)(local_2a0 + lVar29 * 8 + -8);
            *(undefined8 *)(local_2a0 + lVar29 * 8 + -8) =
                 *(undefined8 *)(local_2a0 + lVar29 * 8 + (long)(iVar20 / 5) * 0x28 + -8);
            *(undefined8 *)(local_2a0 + lVar29 * 8 + (long)(iVar20 / 5) * 0x28 + -8) = uVar1;
          }
        }
        if (iVar20 % 5 != 0) {
          lVar29 = (long)(iVar20 % 5);
          for (lVar23 = 0; lVar23 != 200; lVar23 = lVar23 + 0x28) {
            uVar1 = *(undefined8 *)(local_2a0 + lVar23 + -8);
            *(undefined8 *)(local_2a0 + lVar23 + -8) =
                 *(undefined8 *)(local_2a0 + lVar23 + lVar29 * 8 + -8);
            *(undefined8 *)(local_2a0 + lVar23 + lVar29 * 8 + -8) = uVar1;
            uVar1 = *(undefined8 *)((long)&local_168 + lVar23);
            *(undefined8 *)((long)&local_168 + lVar23) =
                 *(undefined8 *)((long)&local_168 + lVar23 + lVar29 * 8);
            *(undefined8 *)((long)&local_168 + lVar23 + lVar29 * 8) = uVar1;
          }
        }
        dVar42 = 1.0 / local_2a8;
        local_2a8 = 1.0;
        dVar13 = (double)local_2a0 * dVar42;
        dVar10 = dStack_298 * dVar42;
        unique0x100003fb = SUB84(dVar10,0);
        local_2a0 = (undefined1  [8])dVar13;
        unique0x100003ff = (int)((ulong)dVar10 >> 0x20);
        dVar11 = (double)local_290._0_8_ * dVar42;
        dVar42 = (double)local_290._8_8_ * dVar42;
        local_290._8_4_ = SUB84(dVar42,0);
        local_290._0_8_ = dVar11;
        local_290._12_4_ = (int)((ulong)dVar42 >> 0x20);
        for (lVar29 = 0x40; lVar29 != 0xe0; lVar29 = lVar29 + 0x28) {
          dVar41 = *(double *)((long)adStack_2c0 + lVar29);
          if ((dVar41 != 0.0) || (NAN(dVar41))) {
            *(undefined8 *)((long)adStack_2c0 + lVar29) = 0;
            dVar44 = *(double *)((long)&local_2b0 + lVar29);
            dVar17 = *(double *)(local_2a0 + lVar29 + -8);
            dVar43 = *(double *)(local_2a0 + lVar29);
            *(double *)((long)adStack_2c0 + lVar29 + 8) =
                 *(double *)((long)adStack_2c0 + lVar29 + 8) - dVar41 * dVar13;
            *(double *)((long)&local_2b0 + lVar29) = dVar44 - dVar41 * dVar10;
            *(double *)(local_2a0 + lVar29 + -8) = dVar17 - dVar41 * dVar11;
            *(double *)(local_2a0 + lVar29) = dVar43 - dVar41 * dVar42;
          }
        }
        uVar22 = 6;
        dVar13 = ABS(local_278);
        for (lVar29 = 0; (int)lVar29 != 0x12; lVar29 = lVar29 + 1) {
          dVar10 = ABS(*(double *)(local_270 + lVar29 * 8));
          if (dVar13 < dVar10) {
            uVar22 = lVar29 + 7;
          }
          uVar22 = uVar22 & 0xffffffff;
          if (dVar10 <= dVar13) {
            dVar10 = dVar13;
          }
          dVar13 = dVar10;
        }
        dVar10 = dVar13;
        if (dVar13 <= dVar9) {
          dVar10 = dVar9;
        }
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          uVar30 = (long)(int)uVar22 % 5;
          if (9 < (int)uVar22) {
            for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
              uVar1 = *(undefined8 *)(local_270 + lVar29 * 8 + -8);
              *(undefined8 *)(local_270 + lVar29 * 8 + -8) =
                   *(undefined8 *)(local_2a0 + lVar29 * 8 + (uVar22 / 5) * 0x28);
              *(undefined8 *)(local_2a0 + lVar29 * 8 + (uVar22 / 5) * 0x28) = uVar1;
            }
          }
          if (1 < (int)uVar30) {
            uVar30 = uVar30 & 0xffffffff;
            for (lVar29 = 0; lVar29 != 200; lVar29 = lVar29 + 0x28) {
              uVar1 = *(undefined8 *)(local_2a0 + lVar29);
              *(undefined8 *)(local_2a0 + lVar29) =
                   *(undefined8 *)(local_2a0 + lVar29 + uVar30 * 8 + -8);
              *(undefined8 *)(local_2a0 + lVar29 + uVar30 * 8 + -8) = uVar1;
              uVar1 = *(undefined8 *)((long)local_160 + lVar29);
              *(undefined8 *)((long)local_160 + lVar29) =
                   *(undefined8 *)((long)&local_168 + lVar29 + uVar30 * 8);
              *(undefined8 *)((long)&local_168 + lVar29 + uVar30 * 8) = uVar1;
            }
          }
          dVar9 = 1.0 / local_278;
          local_278 = 1.0;
          dVar13 = dVar9 * (double)local_270._0_8_;
          auVar12._8_4_ = SUB84(dVar9 * (double)local_270._8_8_,0);
          auVar12._0_8_ = dVar13;
          auVar12._12_4_ = (int)((ulong)(dVar9 * (double)local_270._8_8_) >> 0x20);
          local_270 = auVar12;
          auVar2 = local_270;
          local_260 = dVar9 * local_260;
          for (lVar29 = 0; lVar29 != 0x78; lVar29 = lVar29 + 0x28) {
            dVar9 = *(double *)((long)&dStack_250 + lVar29);
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              *(undefined8 *)((long)&dStack_250 + lVar29) = 0;
              local_270._8_8_ = auVar12._8_8_;
              dVar11 = *(double *)(local_240 + lVar29) - dVar9 * (double)local_270._8_8_;
              auVar14._8_4_ = SUB84(dVar11,0);
              auVar14._0_8_ = *(double *)(local_240 + lVar29 + -8) - dVar9 * dVar13;
              auVar14._12_4_ = (int)((ulong)dVar11 >> 0x20);
              *(undefined1 (*) [16])(local_240 + lVar29 + -8) = auVar14;
              *(double *)(local_240 + lVar29 + 8) =
                   *(double *)(local_240 + lVar29 + 8) - dVar9 * local_260;
            }
          }
          uVar22 = 0xc;
          dVar9 = ABS(local_248);
          for (lVar29 = 0; (int)lVar29 != 0xc; lVar29 = lVar29 + 1) {
            dVar13 = ABS(*(double *)(local_240 + lVar29 * 8));
            if (dVar9 < dVar13) {
              uVar22 = lVar29 + 0xd;
            }
            uVar22 = uVar22 & 0xffffffff;
            if (dVar13 <= dVar9) {
              dVar13 = dVar9;
            }
            dVar9 = dVar13;
          }
          dVar13 = dVar9;
          if (dVar9 <= dVar10) {
            dVar13 = dVar10;
          }
          if ((dVar9 == 0.0) && (!NAN(dVar9))) {
            if (max_pivot == (double *)0x0) {
              return false;
            }
            *max_pivot = dVar13;
            return false;
          }
          uVar30 = (long)(int)uVar22 % 5;
          local_270 = auVar2;
          if (0xe < (int)uVar22) {
            for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
              uVar1 = *(undefined8 *)(local_240 + lVar29 * 8 + -8);
              *(undefined8 *)(local_240 + lVar29 * 8 + -8) =
                   *(undefined8 *)(local_2a0 + lVar29 * 8 + (uVar22 / 5) * 0x28 + 8);
              *(undefined8 *)(local_2a0 + lVar29 * 8 + (uVar22 / 5) * 0x28 + 8) = uVar1;
            }
          }
          if (2 < (int)uVar30) {
            uVar30 = uVar30 & 0xffffffff;
            for (lVar29 = 0; lVar29 != 200; lVar29 = lVar29 + 0x28) {
              uVar1 = *(undefined8 *)(local_2a0 + lVar29 + 8);
              *(undefined8 *)(local_2a0 + lVar29 + 8) =
                   *(undefined8 *)(local_2a0 + lVar29 + uVar30 * 8 + -8);
              *(undefined8 *)(local_2a0 + lVar29 + uVar30 * 8 + -8) = uVar1;
              uVar1 = *(undefined8 *)((long)local_160 + lVar29 + 8U);
              *(undefined8 *)((long)local_160 + lVar29 + 8U) =
                   *(undefined8 *)((long)&local_168 + lVar29 + uVar30 * 8);
              *(undefined8 *)((long)&local_168 + lVar29 + uVar30 * 8) = uVar1;
            }
          }
          dVar9 = 1.0 / local_248;
          local_248 = 1.0;
          dVar10 = dVar9 * (double)local_240;
          dVar9 = dVar9 * adStack_238[0];
          unique0x1000041f = SUB84(dVar9,0);
          local_240 = (undefined1  [8])dVar10;
          unique0x10000423 = (int)((ulong)dVar9 >> 0x20);
          auVar2 = _local_240;
          for (lVar29 = 0; auVar3 = _local_218, lVar29 != 0x50; lVar29 = lVar29 + 0x28) {
            dVar9 = *(double *)((long)adStack_238 + lVar29 + 0x18);
            if ((dVar9 != 0.0) || (NAN(dVar9))) {
              *(undefined8 *)((long)adStack_238 + lVar29 + 0x18) = 0;
              dVar11 = *(double *)(local_218 + lVar29 + 8) - dVar9 * adStack_238[0];
              auVar15._8_4_ = SUB84(dVar11,0);
              auVar15._0_8_ = *(double *)(local_218 + lVar29) - dVar9 * dVar10;
              auVar15._12_4_ = (int)((ulong)dVar11 >> 0x20);
              *(undefined1 (*) [16])(local_218 + lVar29) = auVar15;
            }
          }
          dVar9 = ABS(local_218);
          dVar11 = ABS(local_218._8_8_);
          dVar42 = dVar11;
          if (dVar11 <= dVar9) {
            dVar42 = dVar9;
          }
          uVar31 = local_1f0._0_4_;
          uVar33 = local_1f0._4_4_;
          dVar44 = ABS(local_1f0._0_8_);
          dVar41 = dVar44;
          if (dVar44 <= dVar42) {
            dVar41 = dVar42;
          }
          uVar37 = local_1f0._8_4_;
          uVar38 = local_1f0._12_4_;
          dVar43 = ABS(local_1f0._8_8_);
          dVar17 = dVar43;
          if (dVar43 <= dVar41) {
            dVar17 = dVar41;
          }
          dVar10 = dVar17;
          if (dVar17 <= dVar13) {
            dVar10 = dVar13;
          }
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            uVar35 = local_218._0_4_;
            uVar36 = local_218._4_4_;
            if ((dVar42 < dVar44) || (dVar41 < dVar43)) {
              _local_218 = local_1f0._0_16_;
              local_1f0._0_16_ = auVar3;
              uVar32 = uVar35;
              uVar34 = uVar36;
            }
            else {
              uVar37 = local_218._8_4_;
              uVar38 = local_218._12_4_;
              uVar32 = uVar31;
              uVar34 = uVar33;
              uVar31 = uVar35;
              uVar33 = uVar36;
            }
            _local_240 = auVar2;
            if ((dVar9 < dVar11 && dVar44 <= dVar42) || (dVar41 < dVar43)) {
              for (lVar29 = 0x18; lVar29 != 0xe0; lVar29 = lVar29 + 0x28) {
                auVar2 = *(undefined1 (*) [16])(local_2a0 + lVar29 + -8);
                auVar7._8_4_ = auVar2._0_4_;
                auVar7._0_8_ = auVar2._8_8_;
                auVar7._12_4_ = auVar2._4_4_;
                *(undefined1 (*) [16])(local_2a0 + lVar29 + -8) = auVar7;
                auVar2 = *(undefined1 (*) [16])((long)&local_168 + lVar29);
                auVar8._8_4_ = auVar2._0_4_;
                auVar8._0_8_ = auVar2._8_8_;
                auVar8._12_4_ = auVar2._4_4_;
                *(undefined1 (*) [16])((long)&local_168 + lVar29) = auVar8;
              }
              uVar31 = local_218._0_4_;
              uVar33 = local_218._4_4_;
              uVar37 = local_218._8_4_;
              uVar38 = local_218._12_4_;
              uVar32 = local_1f0._0_4_;
              uVar34 = local_1f0._4_4_;
            }
            adStack_210[0] =
                 (1.0 / (double)CONCAT44(uVar33,uVar31)) * (double)CONCAT44(uVar38,uVar37);
            local_218 = (undefined1  [8])0x3ff0000000000000;
            if (((double)CONCAT44(uVar34,uVar32) != 0.0) || (NAN((double)CONCAT44(uVar34,uVar32))))
            {
              auVar18._8_8_ = 0;
              auVar18._0_8_ =
                   (double)local_1f0._8_8_ - (double)CONCAT44(uVar34,uVar32) * adStack_210[0];
              local_1f0._0_16_ = auVar18 << 0x40;
            }
            if (max_pivot != (double *)0x0) {
              *max_pivot = dVar10;
            }
            if (min_pivot != (double *)0x0) {
              *min_pivot = dVar10;
            }
            if (local_2b0 != (double *)0x0) {
              *local_2b0 = ABS((double)local_1f0._8_8_);
            }
            lVar29 = 1;
            lVar23 = (long)local_160;
            for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
              lVar26 = lVar23;
              for (lVar27 = lVar29; lVar27 != 5; lVar27 = lVar27 + 1) {
                dVar9 = *(double *)(local_2a0 + lVar27 * 8 + lVar24 * 0x28 + -8);
                dVar13 = -dVar9;
                if ((dVar9 != dVar13) || (NAN(dVar9) || NAN(dVar13))) {
                  for (lVar28 = 0; lVar28 != 200; lVar28 = lVar28 + 0x28) {
                    *(double *)(lVar26 + lVar28) =
                         *(double *)((long)pdVar25 + lVar28) * dVar13 + *(double *)(lVar26 + lVar28)
                    ;
                  }
                }
                lVar26 = lVar26 + 8;
              }
              lVar29 = lVar29 + 1;
              pdVar25 = pdVar25 + 1;
              lVar23 = lVar23 + 8;
            }
            local_1a8 = local_160[3];
            dStack_1a0 = 0.0;
            local_188 = local_120;
            uStack_180 = 0;
            local_2b0 = local_f8;
            local_1d8._8_8_ = 0;
            local_1d8._0_8_ = local_d0;
            local_178 = local_a8;
            uStack_170 = 0;
            adStack_2c0[0] = 2.87384794633109e-317;
            bVar19 = ON_IsDegenrateConicHelper
                               (local_160[3],local_120,(double)local_f8,local_d0,local_a8);
            if (bVar19) {
              return false;
            }
            local_1b8 = local_1b8 * local_1b8;
            local_1a8 = local_1a8 * local_1b8;
            local_188 = local_188 * local_1b8;
            local_1b8 = local_1b8 * (double)local_2b0;
            dVar13 = -local_1c8;
            dVar9 = -dStack_1c0;
            dVar10 = stack0xfffffffffffffe70 * local_178 * dVar9 +
                     dVar13 * (double)local_198._0_8_ * (double)local_1d8._0_8_ +
                     local_1b8 * dVar9 * dVar9 +
                     local_1a8 * dVar13 * dVar13 + dVar13 * local_188 * dVar9;
            dVar9 = (dVar9 * local_188 - (local_1a8 + local_1a8) * local_1c8) +
                    (double)local_198._0_8_ * (double)local_1d8._0_8_;
            dVar13 = (dVar13 * local_188 - (local_1b8 + local_1b8) * dStack_1c0) +
                     stack0xfffffffffffffe70 * local_178;
            uVar39 = (uint)((ulong)local_1a8 >> 0x20);
            dVar11 = local_1a8;
            if (ABS(local_1a8) < ABS(local_1b8)) {
              dVar11 = local_1b8;
            }
            if (dVar11 < 0.0) {
              uVar39 = uVar39 ^ 0x80000000;
              local_188 = -local_188;
              local_1b8 = -local_1b8;
              dVar9 = -dVar9;
              dVar13 = -dVar13;
              dVar10 = -dVar10;
            }
            dVar11 = ABS(local_1a8);
            *(int *)conic = SUB84(local_1a8,0);
            *(uint *)((long)conic + 4) = uVar39;
            conic[1] = local_188;
            conic[2] = local_1b8;
            auVar4._8_4_ = SUB84(dVar13,0);
            auVar4._0_8_ = dVar9;
            auVar4._12_4_ = (int)((ulong)dVar13 >> 0x20);
            *(undefined1 (*) [16])(conic + 3) = auVar4;
            conic[5] = dVar10;
            uVar22 = 0;
            for (uVar30 = 0; uVar30 != 6; uVar30 = uVar30 + 1) {
              if (dVar11 < ABS(conic[uVar30])) {
                uVar22 = uVar30 & 0xffffffff;
                dVar11 = ABS(conic[uVar30]);
              }
            }
            dVar11 = conic[(int)uVar22];
            if ((dVar11 == 0.0) && (!NAN(dVar11))) {
              return false;
            }
            dVar11 = 1.0 / dVar11;
            auVar16._8_4_ = SUB84(local_188 * dVar11,0);
            auVar16._0_8_ = (double)CONCAT44(uVar39,SUB84(local_1a8,0)) * dVar11;
            auVar16._12_4_ = (int)((ulong)(local_188 * dVar11) >> 0x20);
            *(undefined1 (*) [16])conic = auVar16;
            conic[2] = local_1b8 * dVar11;
            auVar5._8_4_ = SUB84(dVar13 * dVar11,0);
            auVar5._0_8_ = dVar9 * dVar11;
            auVar5._12_4_ = (int)((ulong)(dVar13 * dVar11) >> 0x20);
            *(undefined1 (*) [16])(conic + 3) = auVar5;
            conic[5] = dVar10 * dVar11;
            conic[(int)uVar22] = 1.0;
            return true;
          }
        }
        if (max_pivot != (double *)0x0) {
          *max_pivot = dVar10;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_GetConicEquationThrough6Points( 
        int stride, 
        const double* points2d, 
        double conic[6],
        double* max_pivot,
        double* min_pivot,
        double* zero_pivot
        )
{
  // Sets conic[] to the coefficients = (A,B,C,D,E,F),
  // such that A*x*x + B*x*y + C*y*y + D*x + E*y + F = 0
  // for each of the 6 input points.

  // This code is long and ugly.  The reason for unrolling the 
  // obvious loops is to make it as efficient as possible.  
  // Rhino calls this function in time critical situations.
  //

  ON_2dPoint pts[6], bboxmin, bboxmax;
  double scale, x, y, M[5][5], N[5][5], max_piv, min_piv;
  const double* p;
  int i, j, k;

  if ( 0 == conic )
    return false;
  memset(conic,0,6*sizeof(conic[0]));
  if ( max_pivot )
    *max_pivot = 0.0;
  if ( min_pivot )
    *min_pivot = 0.0;
  if ( zero_pivot )
    *zero_pivot = 0.0;

  // copy input points into pts[6] and calculate bounding box
  bboxmin.x = bboxmax.x = pts[0].x = points2d[0];
  bboxmin.y = bboxmax.y = pts[0].y = points2d[1];
  if ( !pts[0].IsValid() )
    return false;
  for ( i = 1; i < 6; i++ )
  {
    points2d += stride;
    pts[i].x = points2d[0];
    pts[i].y = points2d[1];
    if ( !pts[i].IsValid() )
      return false;
    if ( pts[i].x < bboxmin.x ) bboxmin.x = pts[i].x; 
    else if ( pts[i].x > bboxmax.x ) bboxmax.x = pts[i].x;
    if ( pts[i].y < bboxmin.y ) bboxmin.y = pts[i].y; 
    else if ( pts[i].y > bboxmax.y ) bboxmax.y = pts[i].y;
  }

  // translate and scale pts[] so pts[5] is at the origin and
  // (pts[0],...pts[4]) have and have a "diameter" near 1.
  // This keeps the starting coefficients in M[][] less than 5
  // with the largest generally near one.
  x = bboxmax.x-bboxmin.x;
  y = bboxmax.y-bboxmin.y;
  if ( x >= y )
  {
    if ( x > 0.0 )
    {
      y /= x;
      scale = x*sqrt(1.0 + y*y);
    }
    else
      return false;
  }
  else 
  {
    x /= y;
    scale = y*sqrt(1.0 + x*x);
  }
  if ( scale > 0.0 )
    scale = 1.0/scale;
  else
    return false;

  for ( i = 0; i < 5; i++ )
  {
    x = scale*(pts[i].x - pts[5].x);
    y = scale*(pts[i].y - pts[5].y);
    M[i][0] = x*x;
    M[i][1] = x*y;
    M[i][2] = y*y;
    M[i][3] = x;
    M[i][4] = y;
  }

  memset( N,0,sizeof(N) );
  N[0][0] = N[1][1] = N[2][2] = N[3][3] = N[4][4] = 1.0;

  // The conic (A,B,C,D,E) is the kernel of M.

  //////////////////////////////////////////////////////////
  //
  // find first pivot
  //
  j = 0;
  p = &M[0][0];
  x = fabs(*p);
  for ( i = 1; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  max_piv = min_piv = x;
  if ( 0.0 == x )
    return false; // all input points are equal
  i = j/5;
  j %= 5;

  if ( 0 != i )
  {
    // swap rows M[0][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[0][k]; M[0][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( 0 != j )
  {
    // Swap columns M[][0] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][0]; M[k][0] = M[k][j]; M[k][j] = y;
      y = N[k][0]; N[k][0] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[0][] so that M[0][0] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[0][0];
  M[0][0] = 1.0; 
  M[0][1] *= x; M[0][2] *= x; M[0][3] *= x; M[0][4] *= x;

  // kill column M[1,2,3,4][0]
  for ( i = 1; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][0]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][0] = 0.0; // set to zero so search for pivot is faster
      M[i][1] += y*M[0][1]; M[i][2] += y*M[0][2]; M[i][3] += y*M[0][3]; M[i][4] += y*M[0][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find second pivot
  //
  j = 6;
  p = &M[1][1];
  x = fabs(*p);
  for ( i = 7; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // two distinct points in input point list.
  }
  i = j/5;  // should always be >= 1
  j %= 5;   // should always be >= 1

  if ( i > 1 )
  {
    // swap rows M[1][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 1; k < 5; k++ )
    {
      y = M[1][k]; M[1][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 1 )
  {
    // Swap columns M[][1] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][1]; M[k][1] = M[k][j]; M[k][j] = y;
      y = N[k][1]; N[k][1] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[1][] so that M[1][1] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[1][1];
  M[1][1] = 1.0; 
  M[1][2] *= x; M[1][3] *= x; M[1][4] *= x;

  // kill column M[2,3,4][1]
  for ( i = 2; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][1]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][1] = 0.0; // set to zero so search for pivot is faster
      M[i][2] += y*M[1][2]; M[i][3] += y*M[1][3]; M[i][4] += y*M[1][4];
    }
  }


  //////////////////////////////////////////////////////////
  //
  // find third pivot
  //
  j = 12;
  p = &M[2][2];
  x = fabs(*p);
  for ( i = 13; i < 25; i++ )
  {
    if ( x < (y = fabs(*(++p))) )
    {
      x = y;
      j = i;
    }
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // three distinct points in input point list.
  }
  i = j/5;  // should always be >= 2
  j %= 5;   // should always be >= 2

  if ( i > 2 )
  {
    // swap rows M[2][] and M[i][]
    // Do not modify N because row ops act on the left of M.
    for ( k = 2; k < 5; k++ )
    {
      y = M[2][k]; M[2][k] = M[i][k]; M[i][k] = y;
    }
  }
  if ( j > 2 )
  {
    // Swap columns M[][2] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][2]; M[k][2] = M[k][j]; M[k][j] = y;
      y = N[k][2]; N[k][2] = N[k][j]; N[k][j] = y;
    }
  }

  // scale row M[2][] so that M[2][2] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[2][2];
  M[2][2] = 1.0; M[2][3] *= x; M[2][4] *= x;

  // kill column M[3,4][2]
  for ( i = 3; i < 5; i++)
  {
    if ( 0.0 != (y = -M[i][2]) )
    {
      // use row op M[i][] += y*M[0][]
      // Do not modify N because row ops act on the left of M.
      M[i][2] = 0.0; // set to zero so search for pivot is faster
      M[i][3] += y*M[2][3]; M[i][4] += y*M[2][4];
    }
  }

  //////////////////////////////////////////////////////////
  //
  // find fourth pivot
  //
  i = j = 3;
  x = fabs(M[3][3]);
  if ( x < (y = fabs(M[3][4])) )
  {
    x = y; j = 4;
  }
  if ( x < (y = fabs(M[4][3])) )
  {
    x = y; i = 4; j = 3;
  }
  if ( x < (y = fabs(M[4][4])) )
  {
    x = y; i = j = 4;
  }
  if ( x > max_piv ) max_piv = x; else if ( x < min_piv ) min_piv = x;
  if ( 0.0 == x )
  {
    if ( 0 != max_pivot )
      *max_pivot = max_piv;
    return false; // four distinct points in the input point list.
  }

  if ( i > 3 )
  {
    // swap rows M[3][] and M[i][]
    // Do not modify N[][] because row ops act on the left of M.
    y = M[3][3]; M[3][3] = M[4][3]; M[4][3] = y;
    y = M[3][4]; M[3][4] = M[i][4]; M[4][4] = y;
  }
  if ( j > 3 )
  {
    // Swap columns M[][3] and M[][j]
    // Also swap N[][] columns because column swap
    // matrix acts on the right of M.
    for ( k = 0; k < 5; k++ )
    {
      y = M[k][3]; M[k][3] = M[k][4]; M[k][4] = y;
      y = N[k][3]; N[k][3] = N[k][4]; N[k][4] = y;
    }
  }

  // scale row M[3][] so that M[3][3] = 1.
  // Do not modify N because row ops act on the left of M.
  x = 1.0/M[3][3];
  M[3][3] = 1.0; 
  M[3][4] *= x;

  // kill column M[4][3]
  if ( 0.0 != M[4][3] )
  {
    // use row op M[i][] += y*M[3][]
    // Do not modify N because row ops act on the left of M.
    M[4][4] -= M[4][3]*M[3][4];
    M[4][3] = 0.0; // set to zero so search for pivot is faster
  }

  // By construction, M[][] is singular and M[4][4] should be nearly zero.
  // It should be upper triangular with diagonal 1,1,1,1,0-ish
  if ( max_pivot )
    *max_pivot = max_piv;
  if ( min_pivot )
    *min_pivot = max_piv;
  if ( zero_pivot )
    *zero_pivot = fabs(M[4][4]);

  // Use column operations to make M[][] the identity.
  // The operations must also be applied to N[][] in order to
  // calculate the kernel of the original M[][].
  for ( i = 0; i < 4; i++ )
  {
    for (j = i+1; j < 5; j++ )
    {
      if ( 0.0 != (y = -M[i][j]) )
      {
        // waste of time // M[i][j] = 0.0;
        for ( k = 0; k < 5; k++ )
        {
          //M[k][j] += y*M[k][i];
          N[k][j] += y*N[k][i];
        }
      }
    }
  }

  // At this point, M[][] should be reduced to a diagonal matrix with 
  // 1,1,1,1,0 on the diagonal. The vector (A,B,C,D,E) = N*Transpose(0,0,0,0,1)
  // will be in the kernel of the original M[][]. The conic through the 
  // six points( scale*(pts[0]-pts[5]),...,scale*(pts[4]-pts[5]),(0,0) ) 
  // is Ax^2 + Bxy + Cy^2 + Dx + Ey = 0.
  // We need to apply the inverse of the scale and then translate by 
  // (pts[5].x,pts[5].y) to get the equation of the conic through the 
  // input point list.

  double A = N[0][4];
  double B = N[1][4];
  double C = N[2][4];
  double D = N[3][4];
  double E = N[4][4];
  // F = 0

  // check for collinear point set
  if ( ON_IsDegenrateConicHelper(A,B,C,D,E) )
  {
    // points lie on one or two lines
    return false;
  }

  // points are not collinear

  // undo the scale we applied when we calculated M[][]
  x = scale*scale;
  A *= x;
  B *= x;
  C *= x;
  D *= scale;
  E *= scale;

  // undo the translation of pts[5] to (0,0) we applied when we calculated M[][]
  x = -pts[5].x;
  y = -pts[5].y;
  double F = A*x*x + B*x*y + C*y*y + D*x + E*y;
  D += 2.0*A*x + B*y;
  E += 2.0*C*y + B*x;

  if ( (fabs(A) >= fabs(C)) ? (A<0.0):(C<0.0) )
  {
    // Make the largest A/C coefficient positive.
    A = -A; B = -B; C = -C; D = -D; E = -E; F = -F;
  }

  conic[0] = A; conic[1] = B; conic[2] = C;
  conic[3] = D; conic[4] = E; conic[5] = F;

  //
  j = 0;
  x = fabs(conic[0]);
  for ( i = 0; i < 6; i++ )
  {
    if ( x < (y = fabs(conic[i])) )
    {
      x = y;
      j = i;
    }
  }
  if ( !(conic[j] != 0.0) )
    return false;
  y = 1.0/conic[j];
  conic[0] *= y; conic[1] *= y; conic[2] *= y; 
  conic[3] *= y; conic[4] *= y; conic[5] *= y; 
  conic[j] = 1.0;

  return true;
}